

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,PowConstExpConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          *prepro)

{
  bool bVar1;
  Type t;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *in_RDX;
  long in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  double ubr;
  double lbr;
  bool pow_int;
  bool ubx_pos;
  bool lbx_neg;
  ModelType *m;
  value_type arg;
  value_type_conflict pwr;
  size_type in_stack_ffffffffffffff98;
  Var v;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_ffffffffffffffa0;
  double dVar5;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *in_stack_ffffffffffffffa8;
  double local_48;
  double local_40;
  byte local_33;
  byte local_32;
  byte local_31;
  ModelType *local_30;
  int local_24;
  double local_20;
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
  GetParameters((CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                 *)(in_RSI + 0x28));
  pvVar2 = std::array<double,_1UL>::operator[]
                     ((array<double,_1UL> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20 = *pvVar2;
  if ((ABS(local_20) != 0.0) || (NAN(ABS(local_20)))) {
    CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
    GetArguments((CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                  *)(local_10 + 0x28));
    pvVar3 = std::array<int,_1UL>::operator[]
                       ((array<int,_1UL> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    v = (Var)(in_stack_ffffffffffffff98 >> 0x20);
    local_24 = *pvVar3;
    if ((local_20 != 1.0) || (NAN(local_20))) {
      local_30 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::GetModel(in_RDI);
      dVar5 = FlatModel<mp::DefaultFlatModelParams>::lb(in_stack_ffffffffffffffa0,v);
      local_31 = dVar5 < 0.0;
      dVar5 = FlatModel<mp::DefaultFlatModelParams>::ub(in_stack_ffffffffffffffa0,v);
      local_32 = 0.0 < dVar5;
      local_33 = FlatModel<mp::DefaultFlatModelParams>::is_integer_value<double>
                           ((double)in_stack_ffffffffffffffa0);
      if ((((bool)local_33) || ((local_31 & 1) == 0)) &&
         ((0.0 <= local_20 || ((local_31 & 1) == 0)))) {
        dVar5 = FlatModel<mp::DefaultFlatModelParams>::lb(in_stack_ffffffffffffffa0,v);
        local_40 = pow(dVar5,local_20);
        dVar5 = FlatModel<mp::DefaultFlatModelParams>::ub(in_stack_ffffffffffffffa0,v);
        local_48 = pow(dVar5,local_20);
        if (((local_33 & 1) != 0) && (0.0 <= local_20)) {
          t = FlatModel<mp::DefaultFlatModelParams>::var_type(in_stack_ffffffffffffffa0,v);
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          ::set_result_type(local_18,t);
          in_stack_ffffffffffffffa8 = local_18;
        }
        bVar1 = FlatModel<mp::DefaultFlatModelParams>::is_integer_value<double>
                          ((double)in_stack_ffffffffffffffa0);
        if (((bVar1) && ((local_31 & 1) != 0)) && ((local_32 & 1) != 0)) {
          pdVar4 = std::max<double>(&local_40,&local_48);
          local_48 = *pdVar4;
          local_40 = 0.0;
        }
        pdVar4 = std::min<double>(&local_40,&local_48);
        dVar5 = *pdVar4;
        std::max<double>(&local_40,&local_48);
        PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
        ::narrow_result_bounds
                  ((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                    *)in_RDI,(double)in_stack_ffffffffffffffa8,dVar5);
      }
    }
    else {
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
      ::set_result_var(local_18,local_24);
    }
  }
  else {
    PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
    ::narrow_result_bounds
              ((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                *)in_RDI,(double)in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstExpConstraint& c, PreprocessInfo& prepro) {
    auto pwr = c.GetParameters()[0];
    if (0.0==std::fabs(pwr)) {              // decidable case
      prepro.narrow_result_bounds(1.0, 1.0);
      return;
    }
    auto arg = c.GetArguments()[0];
    if (1.0==pwr) {                         // decidable case
      prepro.set_result_var(arg);
      return;
    }
    auto& m = MP_DISPATCH( GetModel() );
    bool lbx_neg = m.lb(arg)<0.0;
    bool ubx_pos = m.ub(arg)>0.0;
    bool pow_int = MPD( is_integer_value(pwr) );
    if ((!pow_int && lbx_neg)          // a is fractional, lbx<0
        || (pwr<0 && lbx_neg)) {       // a<0, lbx<=0
      // We _COULD_ PL approximate when pwr<0, pow_int, lbx<0.
      // But we leave it here (don't even narrow result).
      // Gurobi 10 does not handle a<0 && lbx<0.
    } else {
      auto lbr = std::pow(m.lb(arg), pwr),
          ubr = std::pow(m.ub(arg), pwr);
      if (pow_int && pwr>=0.0) {
        // result integer if x integer, a>=0
        prepro.set_result_type( m.var_type(arg) );
      }
      if (MPD( is_integer_value(pwr / 2.0) )) {  // a even
        if (lbx_neg && ubx_pos) {
          ubr = std::max(lbr, ubr);
          lbr = 0.0;
        }
      }  // else, monotone
      prepro.narrow_result_bounds( std::min(lbr, ubr),
                                   std::max(lbr, ubr) );
    }
  }